

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::RecurseError(Parser *this)

{
  string *in_RSI;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Parser *this_local;
  
  this_local = this;
  NumToString<int>(&local_78,*(int *)((long)&in_RSI[0x3b].field_2 + 0xc));
  std::operator+(&local_58,"maximum parsing depth ",&local_78);
  std::operator+(&local_38,&local_58," reached");
  Error(this,in_RSI);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::RecurseError() {
  return Error("maximum parsing depth " + NumToString(parse_depth_counter_) +
               " reached");
}